

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O3

string * __thiscall
duckdb::Hugeint::ToString_abi_cxx11_(string *__return_storage_ptr__,Hugeint *this,hugeint_t input)

{
  long *plVar1;
  OutOfRangeException *this_00;
  size_type *psVar2;
  ulong uVar3;
  uint64_t *in_R8;
  ulong uVar4;
  hugeint_t hVar5;
  hugeint_t lhs;
  string result;
  uint64_t remainder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  ulong local_68;
  string *local_60;
  undefined1 local_58 [8];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar3 = input.lower;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  if (uVar3 == 0x8000000000000000 && this == (Hugeint *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"-170141183460469231731687303715884105728","");
  }
  else {
    uVar4 = uVar3;
    if ((long)uVar3 < 0) {
      if (uVar3 == 0x8000000000000000 && this == (Hugeint *)0x0) {
        this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10,this,uVar3,input.upper);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"Negation of HUGEINT is out of range!","");
        OutOfRangeException::OutOfRangeException(this_00,&local_88);
        __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar4 = ~uVar3 + (ulong)(this == (Hugeint *)0x0);
      this = (Hugeint *)-(long)this;
    }
    hVar5.upper = uVar4;
    hVar5.lower = (uint64_t)this;
    if (this != (Hugeint *)0x0 || uVar4 != 0) {
      local_68 = uVar3;
      local_60 = __return_storage_ptr__;
      do {
        lhs.upper = 10;
        lhs.lower = hVar5.upper;
        hVar5 = DivModPositive((Hugeint *)hVar5.lower,lhs,(uint64_t)local_58,in_R8);
        local_50[0] = local_40;
        ::std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
        plVar1 = (long *)::std::__cxx11::string::_M_append
                                   ((char *)local_50,(ulong)local_a8._M_dataplus._M_p);
        psVar2 = (size_type *)(plVar1 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar1 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar2) {
          local_88.field_2._M_allocated_capacity = *psVar2;
          local_88.field_2._8_8_ = plVar1[3];
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        }
        else {
          local_88.field_2._M_allocated_capacity = *psVar2;
          local_88._M_dataplus._M_p = (pointer)*plVar1;
        }
        local_88._M_string_length = plVar1[1];
        *plVar1 = (long)psVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        __return_storage_ptr__ = local_60;
      } while (hVar5.lower != 0 || hVar5.upper != 0);
      if (local_a8._M_string_length != 0) {
        if ((long)local_68 < 0) {
          ::std::operator+(local_60,"-",&local_a8);
        }
        else {
          (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_60,local_a8._M_dataplus._M_p,
                     local_a8._M_dataplus._M_p + local_a8._M_string_length);
        }
        goto LAB_00da0db3;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"0","");
  }
LAB_00da0db3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string Hugeint::ToString(hugeint_t input) {
	uint64_t remainder;
	string result;
	if (input == NumericLimits<hugeint_t>::Minimum()) {
		return string(Hugeint::HUGEINT_MINIMUM_STRING);
	}
	bool negative = input.upper < 0;
	if (negative) {
		NegateInPlace(input);
	}
	while (true) {
		if (!input.lower && !input.upper) {
			break;
		}
		input = Hugeint::DivModPositive(input, 10, remainder);
		result = string(1, UnsafeNumericCast<char>('0' + remainder)) + result; // NOLINT
	}
	if (result.empty()) {
		// value is zero
		return "0";
	}
	return negative ? "-" + result : result;
}